

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.h
# Opt level: O1

shared_ptr<mocker::ast::VarDeclStmt> __thiscall
mocker::Parser::
makeNode<mocker::ast::VarDeclStmt,std::shared_ptr<mocker::ast::Type>,std::shared_ptr<mocker::ast::Identifier>>
          (Parser *this,Position beg,Position end,shared_ptr<mocker::ast::Type> *args,
          shared_ptr<mocker::ast::Identifier> *args_1)

{
  mapped_type *pmVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<mocker::ast::VarDeclStmt> sVar2;
  shared_ptr<mocker::ast::Identifier> *in_stack_00000010;
  undefined1 local_41;
  shared_ptr<mocker::ast::Type> *local_40;
  Token *local_38;
  
  (this->tokBeg)._M_current = (Token *)0x0;
  local_40 = args;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<mocker::ast::VarDeclStmt,std::allocator<mocker::ast::VarDeclStmt>,std::shared_ptr<mocker::ast::Type>,std::shared_ptr<mocker::ast::Identifier>>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&this->tokEnd,(VarDeclStmt **)this,
             (allocator<mocker::ast::VarDeclStmt> *)&local_41,
             (shared_ptr<mocker::ast::Type> *)args_1,in_stack_00000010);
  std::__shared_ptr<mocker::ast::VarDeclStmt,(__gnu_cxx::_Lock_policy)2>::
  _M_enable_shared_from_this_with<mocker::ast::VarDeclStmt,mocker::ast::VarDeclStmt>
            ((__shared_ptr<mocker::ast::VarDeclStmt,(__gnu_cxx::_Lock_policy)2> *)this,
             (VarDeclStmt *)(this->tokBeg)._M_current);
  local_38 = (this->tokBeg)._M_current;
  pmVar1 = std::__detail::
           _Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::pair<mocker::Position,_mocker::Position>_>,_std::allocator<std::pair<const_unsigned_long,_std::pair<mocker::Position,_mocker::Position>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[](*(_Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::pair<mocker::Position,_mocker::Position>_>,_std::allocator<std::pair<const_unsigned_long,_std::pair<mocker::Position,_mocker::Position>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                          **)(beg.line + 0x10),(key_type *)&local_38);
  (pmVar1->first).line = beg.col;
  (pmVar1->first).col = end.line;
  (pmVar1->second).line = end.col;
  (pmVar1->second).col = (size_t)local_40;
  sVar2.super___shared_ptr<mocker::ast::VarDeclStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar2.super___shared_ptr<mocker::ast::VarDeclStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<mocker::ast::VarDeclStmt>)
         sVar2.super___shared_ptr<mocker::ast::VarDeclStmt,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Node> makeNode(Position beg, Position end, Args &&... args) {
    auto res = std::make_shared<Node>(std::forward<Args>(args)...);
    pos[res->getID()] = std::make_pair(beg, end);
    return res;
  }